

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O1

var * __thiscall cs::runtime_type::parse_dot_lhs(runtime_type *this,var *a,token_base *b)

{
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  constant_values *pcVar3;
  undefined4 extraout_var_01;
  shared_ptr<cs::name_space> *psVar4;
  undefined4 extraout_var_02;
  type_t *this_00;
  namespace_t *pnVar5;
  var *pvVar6;
  undefined4 extraout_var_03;
  structure *this_01;
  undefined4 extraout_var_04;
  undefined *puVar7;
  runtime_error *prVar8;
  callable *pcVar9;
  string local_90 [3];
  
  if (a->mDat == (proxy *)0x0) {
    puVar7 = &void::typeinfo;
  }
  else {
    iVar2 = (*a->mDat->data->_vptr_baseHolder[2])();
    puVar7 = (undefined *)CONCAT44(extraout_var,iVar2);
  }
  pcVar1 = *(char **)(puVar7 + 8);
  if ((pcVar1 == "N2cs15constant_valuesE") ||
     ((*pcVar1 != '*' && (iVar2 = strcmp(pcVar1,"N2cs15constant_valuesE"), iVar2 == 0)))) {
    pcVar3 = cs_impl::any::const_val<cs::constant_values>(a);
    if (*pcVar3 == local_namepace) {
      pvVar6 = domain_manager::get_var_current<cs::var_id_const&>(&this->storage,(var_id *)(b + 1));
      return pvVar6;
    }
    if (*pcVar3 != global_namespace) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x28);
      local_90[0]._M_dataplus._M_p = (pointer)&local_90[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"Unknown scope tag.","");
      runtime_error::runtime_error(prVar8,local_90);
      __cxa_throw(prVar8,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    pvVar6 = domain_manager::get_var_global<cs::var_id_const&>(&this->storage,(var_id *)(b + 1));
    return pvVar6;
  }
  if (a->mDat == (proxy *)0x0) {
    puVar7 = &void::typeinfo;
  }
  else {
    iVar2 = (*a->mDat->data->_vptr_baseHolder[2])();
    puVar7 = (undefined *)CONCAT44(extraout_var_00,iVar2);
  }
  pcVar1 = *(char **)(puVar7 + 8);
  if ((pcVar1 == "St10shared_ptrIN2cs10name_spaceEE") ||
     ((*pcVar1 != '*' && (iVar2 = strcmp(pcVar1,"St10shared_ptrIN2cs10name_spaceEE"), iVar2 == 0))))
  {
    psVar4 = cs_impl::any::val<std::shared_ptr<cs::name_space>>(a);
    pvVar6 = domain_type::get_var
                       (((psVar4->super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->m_data,(var_id *)(b + 1));
    return pvVar6;
  }
  if (a->mDat == (proxy *)0x0) {
    puVar7 = &void::typeinfo;
  }
  else {
    iVar2 = (*a->mDat->data->_vptr_baseHolder[2])();
    puVar7 = (undefined *)CONCAT44(extraout_var_01,iVar2);
  }
  pcVar1 = *(char **)(puVar7 + 8);
  if ((pcVar1 != "N2cs6type_tE") &&
     ((*pcVar1 == '*' || (iVar2 = strcmp(pcVar1,"N2cs6type_tE"), iVar2 != 0)))) {
    if (a->mDat == (proxy *)0x0) {
      puVar7 = &void::typeinfo;
    }
    else {
      iVar2 = (*a->mDat->data->_vptr_baseHolder[2])();
      puVar7 = (undefined *)CONCAT44(extraout_var_02,iVar2);
    }
    pcVar1 = *(char **)(puVar7 + 8);
    if ((pcVar1 != "N2cs9structureE") &&
       ((*pcVar1 == '*' || (iVar2 = strcmp(pcVar1,"N2cs9structureE"), iVar2 != 0)))) {
      pnVar5 = cs_impl::any::get_ext(a);
      pvVar6 = domain_type::get_var
                         (((pnVar5->super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->m_data,(var_id *)(b + 1));
      if (pvVar6->mDat == (proxy *)0x0) {
        puVar7 = &void::typeinfo;
      }
      else {
        iVar2 = (*pvVar6->mDat->data->_vptr_baseHolder[2])();
        puVar7 = (undefined *)CONCAT44(extraout_var_03,iVar2);
      }
      pcVar1 = *(char **)(puVar7 + 8);
      if (pcVar1 != "N2cs8callableE") {
        if (*pcVar1 == '*') {
          return pvVar6;
        }
        iVar2 = strcmp(pcVar1,"N2cs8callableE");
        if (iVar2 != 0) {
          return pvVar6;
        }
      }
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x28);
      local_90[0]._M_dataplus._M_p = (pointer)&local_90[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_90,"Can not visit member function as lvalue.","");
      runtime_error::runtime_error(prVar8,local_90);
      __cxa_throw(prVar8,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    this_01 = cs_impl::any::val<cs::structure>(a);
    pvVar6 = structure::get_var<cs::var_id_const&>(this_01,(var_id *)(b + 1));
    if (pvVar6->mDat == (proxy *)0x0) {
      puVar7 = &void::typeinfo;
    }
    else {
      iVar2 = (*pvVar6->mDat->data->_vptr_baseHolder[2])();
      puVar7 = (undefined *)CONCAT44(extraout_var_04,iVar2);
    }
    pcVar1 = *(char **)(puVar7 + 8);
    if (pcVar1 != "N2cs8callableE") {
      if (*pcVar1 == '*') {
        return pvVar6;
      }
      iVar2 = strcmp(pcVar1,"N2cs8callableE");
      if (iVar2 != 0) {
        return pvVar6;
      }
    }
    pcVar9 = cs_impl::any::const_val<cs::callable>(pvVar6);
    if (pcVar9->mType != member_fn) {
      return pvVar6;
    }
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x28);
    local_90[0]._M_dataplus._M_p = (pointer)&local_90[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,"Can not visit member function as lvalue.","");
    runtime_error::runtime_error(prVar8,local_90);
    __cxa_throw(prVar8,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  this_00 = cs_impl::any::const_val<cs::type_t>(a);
  pvVar6 = type_t::get_var<cs::var_id_const&>(this_00,(var_id *)(b + 1));
  return pvVar6;
}

Assistant:

var &runtime_type::parse_dot_lhs(const var &a, token_base *b)
	{
		if (a.type() == typeid(constant_values)) {
			switch (a.const_val<constant_values>()) {
			case constant_values::global_namespace:
				return storage.get_var_global(static_cast<token_id *>(b)->get_id());
			case constant_values::local_namepace:
				return storage.get_var_current(static_cast<token_id *>(b)->get_id());
			default:
				throw runtime_error("Unknown scope tag.");
			}
		}
		else if (a.type() == typeid(namespace_t))
			return a.val<namespace_t>()->get_var(static_cast<token_id *>(b)->get_id());
		else if (a.type() == typeid(type_t))
			return a.const_val<type_t>().get_var(static_cast<token_id *>(b)->get_id());
		else if (a.type() == typeid(structure)) {
			var &val = a.val<structure>().get_var(static_cast<token_id *>(b)->get_id());
			if (val.type() != typeid(callable) || !val.const_val<callable>().is_member_fn())
				return val;
			else
				throw runtime_error("Can not visit member function as lvalue.");
		}
		else {
			try {
				var &val = a.get_ext()->get_var(static_cast<token_id *>(b)->get_id());
				if (val.type() == typeid(callable))
					throw runtime_error("Can not visit member function as lvalue.");
				else
					return val;
			}
			catch (...) {
				if (a.type() == typeid(hash_map)) {
					auto &cmap = a.val<hash_map>();
					const string &str = static_cast<token_id *>(b)->get_id().get_id();
					if (cmap.count(str) == 0)
						throw runtime_error(std::string("Key \"") + str + "\" does not exist.");
					return cmap.at(str);
				}
				else
					throw;
			}
		}
	}